

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_32bit(exr_context_t ctxt,_internal_exr_seq_scratch *scratch,void *attrdata,char *aname,
                  char *tname,int32_t attrsz,int32_t num)

{
  int iVar1;
  undefined8 in_RCX;
  void *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int in_R9D;
  int in_stack_00000008;
  exr_result_t rv;
  exr_result_t local_4;
  
  if (in_R9D == in_stack_00000008 << 2) {
    iVar1 = (**(code **)(in_RSI + 0x20))(in_RSI,in_RDX,(long)in_stack_00000008 << 2);
    if (iVar1 == 0) {
      priv_to_native32(in_RDX,in_stack_00000008);
      local_4 = 0;
    }
    else {
      local_4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,iVar1,"Unable to read \'%s\' %s data",in_RCX,in_R8);
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0x11,
                         "Attribute \'%s\': Invalid size %d (exp \'%s\' size 4 * %d (%d))",in_RCX,
                         in_R9D,in_R8);
  }
  return local_4;
}

Assistant:

static exr_result_t
extract_attr_32bit (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    void*                             attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz,
    int32_t                           num)
{
    exr_result_t rv;
    if (attrsz != 4 * num)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s': Invalid size %d (exp '%s' size 4 * %d (%d))",
            aname,
            attrsz,
            tname,
            num,
            4 * num);

    rv = scratch->sequential_read (scratch, attrdata, 4 * (uint64_t) num);
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt, rv, "Unable to read '%s' %s data", aname, tname);

    priv_to_native32 (attrdata, num);
    return rv;
}